

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O0

plugin plugin_manager_create(plugin_manager manager,char *name,void *impl,_func_void_plugin *dtor)

{
  int iVar1;
  plugin in_RDX;
  plugin_manager in_RSI;
  _func_void_plugin *unaff_retaddr;
  plugin p;
  char *in_stack_ffffffffffffffc8;
  plugin_manager in_stack_ffffffffffffffd0;
  plugin local_8;
  
  local_8 = plugin_manager_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_8 == (plugin)0x0) {
    local_8 = plugin_loader_load((plugin_loader_conflict)impl,(char *)dtor,p,unaff_retaddr);
    if (local_8 == (plugin)0x0) {
      local_8 = (plugin)0x0;
    }
    else {
      iVar1 = plugin_manager_register(in_RSI,in_RDX);
      if (iVar1 != 0) {
        plugin_destroy((plugin)0x103553);
        local_8 = (plugin)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

plugin plugin_manager_create(plugin_manager manager, const char *name, void *impl, void (*dtor)(plugin))
{
	/* Check if plugin is already loaded and return it */
	plugin p = plugin_manager_get(manager, name);

	if (p != NULL)
	{
		return p;
	}

	/* Load the plugin (dynamic library) and initialize the interface */
	p = plugin_loader_load(manager->l, name, impl, dtor);

	if (p == NULL)
	{
		return NULL;
	}

	/* Register plugin into the plugin manager set */
	if (plugin_manager_register(manager, p) != 0)
	{
		plugin_destroy(p);
		return NULL;
	}

	return p;
}